

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O0

int read_field_headers(OperationConfig *config,char *filename,FILE *fp,curl_slist **pheaders)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  bool bVar6;
  undefined4 local_43c;
  char local_438 [4];
  int c;
  char hdrbuf [999];
  uint local_48;
  int lineno;
  _Bool incomment;
  size_t pos;
  size_t hdrlen;
  curl_slist **pheaders_local;
  FILE *fp_local;
  char *filename_local;
  OperationConfig *config_local;
  
  pos = 0;
  _lineno = 0;
  bVar2 = false;
  local_48 = 1;
  do {
    local_43c = getc((FILE *)fp);
    if ((local_43c == 0xffffffff) ||
       ((_lineno == 0 && (iVar3 = Curl_isspace(local_43c & 0xff), iVar3 == 0)))) {
      while( true ) {
        bVar6 = false;
        if (pos != 0) {
          iVar3 = Curl_isspace((uint)(byte)local_438[pos - 1]);
          bVar6 = iVar3 != 0;
        }
        if (!bVar6) break;
        pos = pos - 1;
      }
      if (pos != 0) {
        local_438[pos] = '\0';
        iVar3 = slist_append(pheaders,local_438);
        if (iVar3 != 0) {
          curl_mfprintf(config->global->errors,"Out of memory for field headers!\n");
          return -1;
        }
        pos = 0;
      }
    }
    switch(local_43c) {
    case 10:
      _lineno = 0;
      bVar2 = false;
      local_48 = local_48 + 1;
      break;
    case 0xd:
      break;
    case 0x23:
      if (_lineno == 0) {
        bVar2 = true;
      }
    default:
      _lineno = _lineno + 1;
      if (!bVar2) {
        if (pos == 0x3e6) {
          warnf(config->global,"File %s line %d: header too long (truncated)\n",filename,
                (ulong)local_48);
          local_43c = 0x20;
        }
        if (pos < 999) {
          local_438[pos] = (char)local_43c;
          pos = pos + 1;
        }
      }
      break;
    case 0xffffffff:
      iVar3 = ferror((FILE *)fp);
      if (iVar3 == 0) {
        config_local._4_4_ = 0;
      }
      else {
        pFVar1 = config->global->errors;
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        curl_mfprintf(pFVar1,"Header file %s read error: %s\n",filename,pcVar5);
        config_local._4_4_ = -1;
      }
      return config_local._4_4_;
    }
  } while( true );
}

Assistant:

static int read_field_headers(struct OperationConfig *config,
                              const char *filename, FILE *fp,
                              struct curl_slist **pheaders)
{
  size_t hdrlen = 0;
  size_t pos = 0;
  bool incomment = FALSE;
  int lineno = 1;
  char hdrbuf[999]; /* Max. header length + 1. */

  for(;;) {
    int c = getc(fp);
    if(c == EOF || (!pos && !ISSPACE(c))) {
      /* Strip and flush the current header. */
      while(hdrlen && ISSPACE(hdrbuf[hdrlen - 1]))
        hdrlen--;
      if(hdrlen) {
        hdrbuf[hdrlen] = '\0';
        if(slist_append(pheaders, hdrbuf)) {
          fprintf(config->global->errors,
                  "Out of memory for field headers!\n");
          return -1;
        }
        hdrlen = 0;
      }
    }

    switch(c) {
    case EOF:
      if(ferror(fp)) {
        fprintf(config->global->errors,
                "Header file %s read error: %s\n", filename, strerror(errno));
        return -1;
      }
      return 0;    /* Done. */
    case '\r':
      continue;    /* Ignore. */
    case '\n':
      pos = 0;
      incomment = FALSE;
      lineno++;
      continue;
    case '#':
      if(!pos)
        incomment = TRUE;
      break;
    }

    pos++;
    if(!incomment) {
      if(hdrlen == sizeof(hdrbuf) - 1) {
        warnf(config->global, "File %s line %d: header too long (truncated)\n",
              filename, lineno);
        c = ' ';
      }
      if(hdrlen <= sizeof(hdrbuf) - 1)
        hdrbuf[hdrlen++] = (char) c;
    }
  }
  /* NOTREACHED */
}